

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

CCharmapToLocal * CCharmapToLocal::load(CResLoader *res_loader,char *table_name)

{
  int iVar1;
  FILE *__stream;
  osfildef *in_stack_00000068;
  CCharmapToLocal *in_stack_00000070;
  charmap_type_t map_type;
  CCharmapToLocal *mapper;
  osfildef *fp;
  CCharmapToLocalUTF8 *in_stack_ffffffffffffff20;
  CCharmapToLocal8859_1 *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  charmap_type_t *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  CResLoader *in_stack_ffffffffffffffc8;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_8;
  
  iVar1 = CCharmap::name_is_utf8_synonym((char *)in_stack_ffffffffffffff20);
  if (iVar1 == 0) {
    iVar1 = CCharmap::name_is_ucs2le_synonym((char *)in_stack_ffffffffffffff20);
    if (iVar1 == 0) {
      iVar1 = CCharmap::name_is_ucs2be_synonym((char *)in_stack_ffffffffffffff20);
      if (iVar1 == 0) {
        local_28 = (CCharmapToLocal *)0x0;
        __stream = (FILE *)CCharmap::open_map_file_syn
                                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                      in_stack_ffffffffffffffb8);
        if (__stream == (FILE *)0x0) {
          iVar1 = CCharmap::name_is_ascii_synonym((char *)in_stack_ffffffffffffff20);
          if (iVar1 == 0) {
            iVar1 = CCharmap::name_is_8859_1_synonym((char *)in_stack_ffffffffffffff20);
            if (iVar1 == 0) {
              local_8 = (CCharmapToLocal *)0x0;
            }
            else {
              local_8 = (CCharmapToLocal *)operator_new(0x1028);
              CCharmapToLocal8859_1::CCharmapToLocal8859_1(in_stack_ffffffffffffff40);
            }
          }
          else {
            local_8 = (CCharmapToLocal *)operator_new(0x1028);
            CCharmapToLocalASCII::CCharmapToLocalASCII
                      ((CCharmapToLocalASCII *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          }
        }
        else {
          if (local_2c == 0) {
            local_28 = (CCharmapToLocal *)operator_new(0x1028);
            memset(local_28,0,0x1028);
            CCharmapToLocalSB::CCharmapToLocalSB((CCharmapToLocalSB *)in_stack_ffffffffffffff20);
          }
          else if (local_2c == 1) {
            local_28 = (CCharmapToLocal *)operator_new(0x1028);
            memset(local_28,0,0x1028);
            CCharmapToLocalDB::CCharmapToLocalDB((CCharmapToLocalDB *)in_stack_ffffffffffffff20);
          }
          else if (local_2c == 2) {
            local_28 = (CCharmapToLocal *)operator_new(0x1028);
            memset(local_28,0,0x1028);
            CCharmapToLocalMB::CCharmapToLocalMB((CCharmapToLocalMB *)local_28);
          }
          if (local_28 != (CCharmapToLocal *)0x0) {
            load_table(in_stack_00000070,in_stack_00000068);
          }
          fclose(__stream);
          local_8 = local_28;
        }
      }
      else {
        local_8 = (CCharmapToLocal *)operator_new(0x1028);
        memset(local_8,0,0x1028);
        CCharmapToLocalUcs2Big::CCharmapToLocalUcs2Big
                  ((CCharmapToLocalUcs2Big *)in_stack_ffffffffffffff20);
      }
    }
    else {
      local_8 = (CCharmapToLocal *)operator_new(0x1028);
      memset(local_8,0,0x1028);
      CCharmapToLocalUcs2Little::CCharmapToLocalUcs2Little
                ((CCharmapToLocalUcs2Little *)in_stack_ffffffffffffff20);
    }
  }
  else {
    local_8 = (CCharmapToLocal *)operator_new(0x1028);
    memset(local_8,0,0x1028);
    CCharmapToLocalUTF8::CCharmapToLocalUTF8(in_stack_ffffffffffffff20);
  }
  return local_8;
}

Assistant:

CCharmapToLocal *CCharmapToLocal::load(CResLoader *res_loader,
                                       const char *table_name)
{
    osfildef *fp;
    CCharmapToLocal *mapper;
    charmap_type_t map_type;

    /* if they want a trivial UTF-8 translator, return one */
    if (name_is_utf8_synonym(table_name))
        return new CCharmapToLocalUTF8();

    /* if they want a Unicode 16-bit encoding, return one */
    if (name_is_ucs2le_synonym(table_name))
        return new CCharmapToLocalUcs2Little();

    if (name_is_ucs2be_synonym(table_name))
        return new CCharmapToLocalUcs2Big();

    /* presume failure */
    mapper = 0;

    /* open and characterize the mapping file */
    fp = open_map_file_syn(res_loader, table_name, &map_type);

    /* if we didn't find a map file, check for built-in mappings */
    if (fp == 0)
    {
        /* if they want a plain ASCII translator, return a default one */
        if (name_is_ascii_synonym(table_name))
            return new CCharmapToLocalASCII();

        /* if they want a plain ISO-8859-1 translator, return a default one */
        if (name_is_8859_1_synonym(table_name))
            return new CCharmapToLocal8859_1();

        /* no map file - return failure */
        return 0;
    }

    /* create an appropriate mapper */
    switch(map_type)
    {
    case CHARMAP_TYPE_SB:
        /* create a single-byte mapper */
        mapper = new CCharmapToLocalSB();
        break;

    case CHARMAP_TYPE_DB:
        /* create a double-byte mapper */
        mapper = new CCharmapToLocalDB();
        break;

    case CHARMAP_TYPE_MB:
        /* create a mixed multi-byte mapper */
        mapper = new CCharmapToLocalMB();
        break;

    default:
        /* other mapper types are currently unknown */
        break;
    }

    /* if we successfully created a mapper, tell it to load the table */
    if (mapper != 0)
    {
        /* load the table */
        mapper->load_table(fp);
    }

    /* close the file */
    osfcls(fp);

    /* return the mapper, if any */
    return mapper;
}